

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::MemoryStressCase::iterate(MemoryStressCase *this)

{
  ostringstream *this_00;
  pointer *ppOVar1;
  bool bVar2;
  deUint32 seed;
  int iVar3;
  TestLog *pTVar4;
  int *piVar5;
  EGLConfig pvVar6;
  qpTestResult testResult;
  pointer pOVar7;
  ObjectType OVar8;
  int iVar9;
  MemoryAllocator *pMVar10;
  deUint64 dVar11;
  MessageBuilder *this_01;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *description;
  int ndx;
  int iVar15;
  TestContext *pTVar16;
  pointer pOVar17;
  float fVar18;
  value_type local_1dc;
  pointer local_1d8;
  undefined8 uStack_1d0;
  int *local_1c8;
  deUint64 local_1c0;
  vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  types;
  
  pTVar16 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  pTVar4 = pTVar16->m_log;
  types.
  super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar4;
  if (this->m_iteration < this->m_iterationCount) {
    local_1c8 = &this->m_iteration;
    pMVar10 = this->m_allocator;
    if (pMVar10 == (MemoryAllocator *)0x0) {
      pMVar10 = (MemoryAllocator *)operator_new(0x1ac0);
      seed = this->m_seed;
      local_1d8._0_4_ = (float)(this->m_spec).types;
      local_1d8._4_4_ = (this->m_spec).minWidth;
      uStack_1d0._0_4_ = (this->m_spec).minHeight;
      uStack_1d0._4_4_ = (this->m_spec).maxWidth;
      iVar15 = (this->m_spec).maxHeight;
      bVar2 = (this->m_spec).use;
      pMVar10->m_eglTestCtx = (this->super_TestCase).m_eglTestCtx;
      pvVar6 = this->m_config;
      pMVar10->m_display = this->m_display;
      pMVar10->m_config = pvVar6;
      glw::Functions::Functions(&pMVar10->m_gl);
      deRandom_init(&(pMVar10->m_rnd).m_rnd,seed);
      pMVar10->m_failed = false;
      (pMVar10->m_errorString)._M_dataplus._M_p = (pointer)&(pMVar10->m_errorString).field_2;
      (pMVar10->m_errorString)._M_string_length = 0;
      (pMVar10->m_errorString).field_2._M_local_buf[0] = '\0';
      *(pointer *)&pMVar10->m_types = local_1d8;
      pMVar10->m_minHeight = (undefined4)uStack_1d0;
      pMVar10->m_maxWidth = uStack_1d0._4_4_;
      pMVar10->m_maxHeight = iVar15;
      pMVar10->m_use = bVar2;
      (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      EglTestContext::initGLFunctions(pMVar10->m_eglTestCtx,&pMVar10->m_gl,(ApiType)0x2);
      this->m_allocator = pMVar10;
    }
    local_1c0 = deGetMicroseconds();
    types.
    super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    types.
    super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    types.
    super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    OVar8 = pMVar10->m_types;
    if ((OVar8 & OBJECTTYPE_CONTEXT) != 0) {
      local_1dc = OBJECTTYPE_CONTEXT;
      std::
      vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
      ::push_back(&types,&local_1dc);
      OVar8 = pMVar10->m_types;
    }
    if ((OVar8 & OBJECTTYPE_PBUFFER) != 0) {
      local_1dc = OBJECTTYPE_PBUFFER;
      std::
      vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
      ::push_back(&types,&local_1dc);
    }
    if ((((pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (pMVar10->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start) &&
        ((pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (pMVar10->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start)) && (pMVar10->m_use == true)) {
      egl::anon_unknown_0::MemoryAllocator::allocateContext(pMVar10);
      egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(pMVar10);
    }
    pOVar7 = types.
             super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1d8 = types.
                super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pMVar10->m_failed != false) {
        std::
        vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
        ::~vector(&types);
        ppOVar1 = &types.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        types.
        super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
        std::operator<<((ostream *)ppOVar1,"Iteration ");
        this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&types,local_1c8);
        this_00 = &this_01->m_str;
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,": Allocated ")
        ;
        iVar15 = egl::anon_unknown_0::MemoryAllocator::getAllocationCount(this->m_allocator);
        std::ostream::operator<<(this_00,iVar15);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," objects; ");
        std::ostream::operator<<
                  (this_00,(int)((ulong)((long)(this->m_allocator->m_contexts).
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->m_allocator->m_contexts).
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," contexts, ");
        std::ostream::operator<<
                  (this_00,(int)((ulong)((long)(this->m_allocator->m_pbuffers).
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->m_allocator->m_pbuffers).
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," PBuffers.");
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
        ppOVar1 = &types.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        types.
        super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
        std::operator<<((ostream *)ppOVar1,"Got expected error: ");
        std::operator<<((ostream *)ppOVar1,(string *)&this->m_allocator->m_errorString);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&types,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
        iVar15 = egl::anon_unknown_0::MemoryAllocator::getAllocationCount(this->m_allocator);
        types.
        super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(types.
                               super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar15);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->m_allocationCounts,(int *)&types);
        pMVar10 = this->m_allocator;
        if (pMVar10 != (MemoryAllocator *)0x0) {
          egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar10);
        }
        operator_delete(pMVar10,0x1ac0);
        this->m_allocator = (MemoryAllocator *)0x0;
        this->m_iteration = this->m_iteration + 1;
        return CONTINUE;
      }
      OVar8 = 0;
      iVar15 = 0;
      for (pOVar17 = local_1d8; pOVar17 != pOVar7; pOVar17 = pOVar17 + 1) {
        if ((iVar15 < 1) || (iVar9 = de::Random::getInt(&pMVar10->m_rnd,0,iVar15), iVar9 < 1)) {
          OVar8 = *pOVar17;
        }
        iVar15 = iVar15 + 1;
      }
      if (OVar8 == OBJECTTYPE_PBUFFER) {
        egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(pMVar10);
      }
      else if (OVar8 == OBJECTTYPE_CONTEXT) {
        egl::anon_unknown_0::MemoryAllocator::allocateContext(pMVar10);
      }
      dVar11 = deGetMicroseconds();
    } while (dVar11 - local_1c0 < 0x989681);
    std::
    vector<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ::~vector(&types);
    ppOVar1 = &types.
               super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    types.
    super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
    std::operator<<((ostream *)ppOVar1,"Couldn\'t exhaust memory before timeout. Allocated ");
    iVar15 = egl::anon_unknown_0::MemoryAllocator::getAllocationCount(this->m_allocator);
    std::ostream::operator<<(ppOVar1,iVar15);
    std::operator<<((ostream *)ppOVar1," objects.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&types,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    pMVar10 = this->m_allocator;
    if (pMVar10 != (MemoryAllocator *)0x0) {
      egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar10);
    }
    operator_delete(pMVar10,0x1ac0);
    this->m_allocator = (MemoryAllocator *)0x0;
  }
  else {
    piVar5 = (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = *piVar5;
    uVar12 = (ulong)((long)(this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
    uVar14 = 0;
    iVar9 = iVar15;
    uVar13 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      uVar13 = uVar14;
    }
    for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      iVar3 = piVar5[uVar14];
      if (iVar3 < iVar9) {
        iVar9 = iVar3;
      }
      if (iVar15 < iVar3) {
        iVar15 = iVar3;
      }
    }
    if (iVar9 == 0 && iVar15 != 0) {
      ppOVar1 = &types.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
      std::operator<<((ostream *)ppOVar1,"Allocation count zero");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&types,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
      pTVar16 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      fVar18 = (float)(iVar9 - iVar15) / (float)iVar15;
      local_1d8 = (pointer)CONCAT44(local_1d8._4_4_,fVar18);
      if (fVar18 <= 50.0) {
        tcu::TestContext::setTestResult(pTVar16,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      ppOVar1 = &types.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::ObjectType,_std::allocator<deqp::egl::(anonymous_namespace)::ObjectType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
      std::operator<<((ostream *)ppOVar1,"Allocated objects max: ");
      std::ostream::operator<<(ppOVar1,iVar15);
      std::operator<<((ostream *)ppOVar1,", min: ");
      std::ostream::operator<<(ppOVar1,iVar9);
      std::operator<<((ostream *)ppOVar1,", difference: ");
      std::ostream::operator<<(ppOVar1,local_1d8._0_4_);
      std::operator<<((ostream *)ppOVar1,"% threshold: ");
      std::ostream::operator<<(ppOVar1,50.0);
      std::operator<<((ostream *)ppOVar1,"%");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&types,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
      pTVar16 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Allocation count variation";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    tcu::TestContext::setTestResult(pTVar16,testResult,description);
  }
  return STOP;
}

Assistant:

TestCase::IterateResult MemoryStressCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_iteration < m_iterationCount)
	{
		try
		{
			if (!m_allocator)
				m_allocator = new MemoryAllocator(m_eglTestCtx, m_display, m_config, m_seed, m_spec.types, m_spec.minWidth, m_spec.minHeight, m_spec.maxWidth, m_spec.maxHeight, m_spec.use);

			if (m_allocator->allocateUntilFailure())
			{
				log << TestLog::Message << "Couldn't exhaust memory before timeout. Allocated " << m_allocator->getAllocationCount() << " objects." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

				delete m_allocator;
				m_allocator = NULL;

				return STOP;
			}

			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Got expected error: " << m_allocator->getErrorString() << TestLog::EndMessage;
			m_allocationCounts.push_back(m_allocator->getAllocationCount());

			delete m_allocator;
			m_allocator = NULL;

			m_iteration++;

			return CONTINUE;
		} catch (...)
		{
			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Unexpected error" << TestLog::EndMessage;
			throw;
		}
	}
	else
	{
		// Analyze number of passed allocations.
		int min = m_allocationCounts[0];
		int max = m_allocationCounts[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocationCounts.size(); allocNdx++)
		{
			min = deMin32(m_allocationCounts[allocNdx], min);
			max = deMax32(m_allocationCounts[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			float change = (float)(min - max) / ((float)(max));

			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}

		return STOP;
	}
}